

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_texture_region
               (rf_texture2d texture,rf_rec source_rec,rf_rec dest_rec,rf_vec2 origin,float rotation
               ,rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar17;
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  int local_38;
  int iStack_34;
  
  fVar15 = source_rec.width;
  fVar16 = source_rec.height;
  if (texture.id == 0) {
    return;
  }
  fVar17 = fVar15;
  if (fVar15 < 0.0) {
    fVar17 = -fVar15;
    in_XMM1_Dc = -in_XMM1_Dc;
    in_XMM1_Dd = -in_XMM1_Dd;
  }
  auVar13._8_4_ = source_rec.x;
  auVar13._12_4_ = source_rec.y;
  local_98 = source_rec.x;
  fStack_94 = source_rec.y;
  if (fVar16 < 0.0) {
    fStack_94 = fStack_94 - fVar16;
  }
  rf_gfx_enable_texture(texture.id);
  rf_gfx_push_matrix();
  local_48 = dest_rec.x;
  fStack_44 = dest_rec.y;
  rf_gfx_translatef(local_48,fStack_44,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  local_58 = origin.x;
  fStack_54 = origin.y;
  rf_gfx_translatef(-local_58,-fStack_54,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  local_38 = texture.width;
  iStack_34 = texture.height;
  local_b8._4_4_ = (float)iStack_34;
  local_b8._0_4_ = (float)local_38;
  local_b8._8_8_ = 0;
  local_78 = dest_rec.width;
  fStack_74 = dest_rec.height;
  if (0.0 <= fVar15) {
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar7._4_4_ = fStack_94;
    auVar7._0_4_ = local_98;
    auVar7._8_4_ = auVar13._8_4_;
    auVar7._12_4_ = auVar13._12_4_;
    auVar9 = divps(auVar7,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
    fVar17 = fVar17 + local_98;
    auVar10._4_4_ = fVar16 + fStack_94;
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar10._0_4_ = local_98;
    auVar10._8_4_ = auVar13._8_4_;
    auVar10._12_4_ = auVar13._12_4_;
    auVar9 = divps(auVar10,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,fStack_74,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar9._4_4_ = auVar10._4_4_;
    auVar9._0_4_ = fVar17;
    auVar9._8_4_ = in_XMM1_Dc + auVar13._8_4_;
    auVar9._12_4_ = in_XMM1_Dd + auVar13._12_4_;
    auVar9 = divps(auVar9,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(local_78,fStack_74,prVar2->current_depth);
    uVar14 = extraout_XMM0_Qb_00;
  }
  else {
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar8._4_4_ = fStack_94;
    auVar8._0_4_ = fVar17 + local_98;
    auVar8._8_4_ = in_XMM1_Dc + auVar13._8_4_;
    auVar8._12_4_ = in_XMM1_Dd + auVar13._12_4_;
    auVar9 = divps(auVar8,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar6._4_4_ = fVar16 + fStack_94;
    auVar6._0_4_ = fVar17 + local_98;
    auVar6._8_4_ = in_XMM1_Dc + auVar13._8_4_;
    auVar6._12_4_ = in_XMM1_Dd + auVar13._12_4_;
    auVar9 = divps(auVar6,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,fStack_74,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    auVar13._4_4_ = fVar16 + fStack_94;
    auVar13._0_4_ = local_98;
    auVar9 = divps(auVar13,local_b8._0_16_);
    *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar9._0_8_;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(local_78,fStack_74,prVar2->current_depth);
    fVar17 = local_98;
    uVar14 = extraout_XMM0_Qb;
  }
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  iVar1 = prVar4[lVar3].tc_counter;
  auVar5._4_8_ = uVar14;
  auVar5._0_4_ = fStack_94;
  auVar11._0_8_ = auVar5._0_8_ << 0x20;
  auVar11._8_4_ = auVar13._8_4_;
  auVar11._12_4_ = auVar13._12_4_;
  auVar12._4_12_ = auVar11._4_12_;
  auVar12._0_4_ = fVar17;
  auVar13 = divps(auVar12,local_b8._0_16_);
  *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar13._0_8_;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_78,0.0,prVar2->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_texture_region(rf_texture2d texture, rf_rec source_rec, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flip_x = false;

        if (source_rec.width < 0) { flip_x = true; source_rec.width *= -1; }
        if (source_rec.height < 0) source_rec.y -= source_rec.height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
            rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
            rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
            rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

            rf_gfx_begin(RF_QUADS);
                rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
                rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                rf_gfx_vertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(0.0f, dest_rec.height);

                // Top-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(dest_rec.width, dest_rec.height);

                // Top-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                rf_gfx_vertex2f(dest_rec.width, 0.0f);
            rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();
    }
}